

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

char * lowstring(char *i)

{
  char cVar1;
  long lVar2;
  char cVar3;
  
  for (lVar2 = 0; (cVar1 = i[lVar2], cVar1 != '\0' && ((uint)lVar2 < 0x11ff)); lVar2 = lVar2 + 1) {
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    lowstring::lowbuf[lVar2] = cVar3;
  }
  lowstring::lowbuf[lVar2] = '\0';
  return lowstring::lowbuf;
}

Assistant:

const char *lowstring(const char *i)
{
	static char lowbuf[MAX_STRING_LENGTH];
	char *o;

	for (o = lowbuf; *i && (unsigned int)(o - lowbuf) < sizeof(lowbuf) - 1; i++, o++)
	{
		*o = LOWER(*i);
	}

	*o = '\0';
	return lowbuf;
}